

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_StoDeriveMatches(Nf_Man_t *p,int fVerbose)

{
  int iVar1;
  Vec_Wec_t *p_00;
  Vec_Wrd_t *p_01;
  int *piVar2;
  Mio_Cell2_t *pMVar3;
  int local_cc;
  int local_c8;
  int i;
  int nPerms [7];
  int *pPerm [7];
  int *local_68;
  int *pComp [7];
  Vec_Wrd_t *vStore;
  Vec_Wec_t *vProfs;
  int fVerbose_local;
  Nf_Man_t *p_local;
  
  p_00 = Vec_WecAlloc(1000);
  p_01 = Vec_WrdAlloc(10000);
  Vec_WecPushLevel(p_00);
  Vec_WecPushLevel(p_00);
  for (local_cc = 1; local_cc < 7; local_cc = local_cc + 1) {
    piVar2 = Extra_GreyCodeSchedule(local_cc);
    pComp[(long)local_cc + -1] = piVar2;
  }
  for (local_cc = 1; local_cc < 7; local_cc = local_cc + 1) {
    piVar2 = Extra_PermSchedule(local_cc);
    *(int **)(nPerms + (long)local_cc * 2 + 6) = piVar2;
  }
  for (local_cc = 1; local_cc < 7; local_cc = local_cc + 1) {
    iVar1 = Extra_Factorial(local_cc);
    (&local_c8)[local_cc] = iVar1;
  }
  pMVar3 = Mio_CollectRootsNewDefault2(6,&p->nCells,fVerbose);
  p->pCells = pMVar3;
  for (local_cc = 2; local_cc < p->nCells; local_cc = local_cc + 1) {
    Nf_StoCreateGateMaches
              (p,p->pCells + local_cc,&local_68,(int **)(nPerms + 6),&local_c8,p_00,p_01);
  }
  for (local_cc = 1; local_cc < 7; local_cc = local_cc + 1) {
    if (pComp[(long)local_cc + -1] != (int *)0x0) {
      free(pComp[(long)local_cc + -1]);
      pComp[(long)local_cc + -1] = (int *)0x0;
    }
  }
  for (local_cc = 1; local_cc < 7; local_cc = local_cc + 1) {
    if (*(long *)(nPerms + (long)local_cc * 2 + 6) != 0) {
      free(*(void **)(nPerms + (long)local_cc * 2 + 6));
      (nPerms + (long)local_cc * 2 + 6)[0] = 0;
      (nPerms + (long)local_cc * 2 + 6)[1] = 0;
    }
  }
  Vec_WecFree(p_00);
  Vec_WrdFree(p_01);
  return;
}

Assistant:

void Nf_StoDeriveMatches( Nf_Man_t * p, int fVerbose )
{
//    abctime clk = Abc_Clock();
    Vec_Wec_t * vProfs = Vec_WecAlloc( 1000 );
    Vec_Wrd_t * vStore = Vec_WrdAlloc( 10000 );
    int * pComp[7], * pPerm[7], nPerms[7], i;
    Vec_WecPushLevel( vProfs );
    Vec_WecPushLevel( vProfs );
    for ( i = 1; i <= 6; i++ )
        pComp[i] = Extra_GreyCodeSchedule( i );
    for ( i = 1; i <= 6; i++ )
        pPerm[i] = Extra_PermSchedule( i );
    for ( i = 1; i <= 6; i++ )
        nPerms[i] = Extra_Factorial( i );
    p->pCells = Mio_CollectRootsNewDefault2( 6, &p->nCells, fVerbose );
    for ( i = 2; i < p->nCells; i++ )
        Nf_StoCreateGateMaches( p, p->pCells + i, pComp, pPerm, nPerms, vProfs, vStore );
    for ( i = 1; i <= 6; i++ )
        ABC_FREE( pComp[i] );
    for ( i = 1; i <= 6; i++ )
        ABC_FREE( pPerm[i] );
    Vec_WecFree( vProfs );
    Vec_WrdFree( vStore );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}